

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::clear
          (InnerMap *this)

{
  bool bVar1;
  reference ppMVar2;
  undefined8 *in_RDI;
  iterator next_1;
  Node *node_1;
  iterator tree_it;
  Tree *tree;
  Node *next;
  Node *node;
  size_type b;
  Node *in_stack_ffffffffffffff38;
  InnerMap *in_stack_ffffffffffffff40;
  const_iterator in_stack_ffffffffffffff48;
  _Self local_a8;
  _Base_ptr local_a0;
  _Base_ptr local_98;
  _Base_ptr local_90;
  Node *local_88;
  _Self local_80 [11];
  undefined8 local_28;
  long local_20;
  long local_18;
  ulong local_10;
  
  for (local_10 = 0; local_10 < (ulong)in_RDI[1]; local_10 = local_10 + 1) {
    bVar1 = TableEntryIsNonEmptyList(in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38)
    ;
    if (bVar1) {
      local_18 = *(long *)(in_RDI[4] + local_10 * 8);
      *(undefined8 *)(in_RDI[4] + local_10 * 8) = 0;
      do {
        local_20 = *(long *)(local_18 + 0x18);
        DestroyNode(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        local_18 = local_20;
      } while (local_20 != 0);
    }
    else {
      bVar1 = TableEntryIsTree(in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
      if (bVar1) {
        local_28 = *(undefined8 *)(in_RDI[4] + local_10 * 8);
        *(undefined8 *)(in_RDI[4] + 8 + local_10 * 8) = 0;
        *(undefined8 *)(in_RDI[4] + local_10 * 8) = 0;
        local_80[0]._M_node =
             (_Base_ptr)
             std::
             set<google::protobuf::MapKey_*,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
             ::begin((set<google::protobuf::MapKey_*,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
                      *)in_stack_ffffffffffffff38);
        do {
          ppMVar2 = std::_Rb_tree_const_iterator<google::protobuf::MapKey_*>::operator*
                              ((_Rb_tree_const_iterator<google::protobuf::MapKey_*> *)
                               in_stack_ffffffffffffff40);
          local_88 = NodePtrFromKeyPtr(*ppMVar2);
          local_90 = local_80[0]._M_node;
          std::_Rb_tree_const_iterator<google::protobuf::MapKey_*>::operator++
                    ((_Rb_tree_const_iterator<google::protobuf::MapKey_*> *)
                     in_stack_ffffffffffffff40);
          local_98 = local_80[0]._M_node;
          local_a0 = (_Base_ptr)
                     std::
                     set<google::protobuf::MapKey*,google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap::KeyCompare,google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey*>>
                     ::erase_abi_cxx11_((set<google::protobuf::MapKey_*,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
                                         *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff48);
          DestroyNode(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
          local_80[0]._M_node = local_90;
          local_a8._M_node =
               (_Base_ptr)
               std::
               set<google::protobuf::MapKey_*,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
               ::end((set<google::protobuf::MapKey_*,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
                      *)in_stack_ffffffffffffff38);
          bVar1 = std::operator!=(local_80,&local_a8);
        } while (bVar1);
        DestroyTree(in_stack_ffffffffffffff40,(Tree *)in_stack_ffffffffffffff38);
        local_10 = local_10 + 1;
      }
    }
  }
  *in_RDI = 0;
  in_RDI[3] = in_RDI[1];
  return;
}

Assistant:

void clear() {
      for (size_type b = 0; b < num_buckets_; b++) {
        if (TableEntryIsNonEmptyList(b)) {
          Node* node = static_cast<Node*>(table_[b]);
          table_[b] = NULL;
          do {
            Node* next = node->next;
            DestroyNode(node);
            node = next;
          } while (node != NULL);
        } else if (TableEntryIsTree(b)) {
          Tree* tree = static_cast<Tree*>(table_[b]);
          GOOGLE_DCHECK(table_[b] == table_[b + 1] && (b & 1) == 0);
          table_[b] = table_[b + 1] = NULL;
          typename Tree::iterator tree_it = tree->begin();
          do {
            Node* node = NodePtrFromKeyPtr(*tree_it);
            typename Tree::iterator next = tree_it;
            ++next;
            tree->erase(tree_it);
            DestroyNode(node);
            tree_it = next;
          } while (tree_it != tree->end());
          DestroyTree(tree);
          b++;
        }
      }
      num_elements_ = 0;
      index_of_first_non_null_ = num_buckets_;
    }